

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::
SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLCreateTextureFromSurfaceFailedDuringLoadTexture_Test
::TestBody(SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLCreateTextureFromSurfaceFailedDuringLoadTexture_Test
           *this)

{
  bool bVar1;
  WrapperMock *pWVar2;
  MockSpec<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  TypedExpectation<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_01;
  MockSpec<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
  *this_02;
  TypedExpectation<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
  *this_03;
  MockSpec<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
  *this_04;
  TypedExpectation<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
  *this_05;
  MockSpec<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
  *this_06;
  TypedExpectation<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
  *this_07;
  PtrDeleterMock *this_08;
  MockSpec<void_(SDL_Surface_*)> *this_09;
  char *message;
  unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_> *x;
  AssertHelper local_418;
  Message local_410 [2];
  runtime_error *anon_var_0;
  type e;
  undefined1 local_3d0 [8];
  _Head_base<0UL,_solitaire::SDL::interfaces::Wrapper_*,_false> _Stack_3c8;
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  WithoutMatchers local_399;
  Matcher<SDL_Surface_*> local_398;
  MockSpec<void_(SDL_Surface_*)> local_380;
  PolymorphicAction local_359;
  Action<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
  local_358;
  WithoutMatchers local_331;
  SDL_Surface *local_330;
  Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&> local_328;
  SDL_Renderer_conflict *local_310;
  Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&> local_308;
  MockSpec<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
  local_2f0;
  ReturnAction<int> local_2b8;
  Action<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
  local_2a8;
  WithoutMatchers local_281;
  Matcher<unsigned_int> local_280;
  Matcher<int> local_268;
  SDL_Surface *local_250;
  Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&> local_248;
  MockSpec<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
  local_230;
  ReturnAction<unsigned_int> local_1e0;
  Action<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
  local_1d0;
  WithoutMatchers local_1a9;
  Matcher<unsigned_char> local_1a8;
  Matcher<unsigned_char> local_190;
  Matcher<unsigned_char> local_178;
  SDL_Surface *local_160;
  Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&> local_158;
  MockSpec<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
  local_140;
  UniquePtr<SDL_Surface> local_d8;
  ByMoveWrapper<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_> local_b0;
  ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_>_>
  local_88;
  Action<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_78;
  WithoutMatchers local_55 [13];
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  MockSpec<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_30;
  SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLCreateTextureFromSurfaceFailedDuringLoadTexture_Test
  *local_10;
  SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLCreateTextureFromSurfaceFailedDuringLoadTexture_Test
  *this_local;
  
  local_10 = this;
  pWVar2 = &mock_ptr<testing::StrictMock<solitaire::SDL::WrapperMock>_>::operator*
                      (&(this->super_SDLGraphicsSystemWithCreatedWindowTests).
                        super_SDLGraphicsSystemTests.sdlMock)->super_WrapperMock;
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher(&local_48,(string *)(anonymous_namespace)::texturePath_abi_cxx11_);
  SDL::WrapperMock::gmock_loadBMP(&local_30,pWVar2,&local_48);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(&local_30,local_55,(void *)0x0);
  this_01 = testing::internal::
            MockSpec<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x10c,"*sdlMock","loadBMP(texturePath)");
  SDLGraphicsSystemWithCreatedWindowTests::makeSDLSurface
            (&local_d8,&this->super_SDLGraphicsSystemWithCreatedWindowTests,(SDL_Surface *)0x5);
  testing::ByMove<std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>>
            (&local_b0,(testing *)&local_d8,x);
  testing::
  Return<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>>>
            ((testing *)&local_88,&local_b0);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_78,(ReturnAction *)&local_88);
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::WillOnce(this_01,&local_78);
  testing::
  Action<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~Action(&local_78);
  testing::internal::
  ReturnAction<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_>_>
  ::~ReturnAction(&local_88);
  testing::internal::
  ByMoveWrapper<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_>::~ByMoveWrapper
            (&local_b0);
  std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>::~unique_ptr(&local_d8);
  testing::internal::
  MockSpec<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~MockSpec(&local_30);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_48);
  pWVar2 = &mock_ptr<testing::StrictMock<solitaire::SDL::WrapperMock>_>::operator*
                      (&(this->super_SDLGraphicsSystemWithCreatedWindowTests).
                        super_SDLGraphicsSystemTests.sdlMock)->super_WrapperMock;
  local_160 = (SDL_Surface *)
              testing::no_adl::Pointer<SDL_Surface*>
                        ((SDL_Surface **)&(anonymous_namespace)::surfacePtr);
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            (&local_158,(PointerMatcher *)&local_160);
  testing::Matcher<unsigned_char>::Matcher(&local_178,'\0');
  testing::Matcher<unsigned_char>::Matcher(&local_190,0xff);
  testing::Matcher<unsigned_char>::Matcher(&local_1a8,0xff);
  SDL::WrapperMock::gmock_mapRGB(&local_140,pWVar2,&local_158,&local_178,&local_190,&local_1a8);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
            ::operator()(&local_140,&local_1a9,(void *)0x0);
  this_03 = testing::internal::
            MockSpec<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
            ::InternalExpectedAt
                      (this_02,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x10e,"*sdlMock","mapRGB(Pointer(surfacePtr), 0, 255, 255)");
  testing::Return<unsigned_int>((testing *)&local_1e0,10);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_1d0,(ReturnAction *)&local_1e0);
  testing::internal::
  TypedExpectation<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
  ::WillOnce(this_03,&local_1d0);
  testing::
  Action<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
  ::~Action(&local_1d0);
  testing::internal::ReturnAction<unsigned_int>::~ReturnAction(&local_1e0);
  testing::internal::
  MockSpec<unsigned_int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_unsigned_char,_unsigned_char,_unsigned_char)>
  ::~MockSpec(&local_140);
  testing::Matcher<unsigned_char>::~Matcher(&local_1a8);
  testing::Matcher<unsigned_char>::~Matcher(&local_190);
  testing::Matcher<unsigned_char>::~Matcher(&local_178);
  testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>::
  ~Matcher(&local_158);
  pWVar2 = &mock_ptr<testing::StrictMock<solitaire::SDL::WrapperMock>_>::operator*
                      (&(this->super_SDLGraphicsSystemWithCreatedWindowTests).
                        super_SDLGraphicsSystemTests.sdlMock)->super_WrapperMock;
  local_250 = (SDL_Surface *)
              testing::no_adl::Pointer<SDL_Surface*>
                        ((SDL_Surface **)&(anonymous_namespace)::surfacePtr);
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            (&local_248,(PointerMatcher *)&local_250);
  testing::Matcher<int>::Matcher(&local_268,1);
  testing::Matcher<unsigned_int>::Matcher(&local_280,10);
  SDL::WrapperMock::gmock_setColorKey(&local_230,pWVar2,&local_248,&local_268,&local_280);
  testing::internal::GetWithoutMatchers();
  this_04 = testing::internal::
            MockSpec<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
            ::operator()(&local_230,&local_281,(void *)0x0);
  this_05 = testing::internal::
            MockSpec<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
            ::InternalExpectedAt
                      (this_04,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x110,"*sdlMock","setColorKey(Pointer(surfacePtr), SDL_TRUE, mapRGBResult)")
  ;
  testing::Return<int>((testing *)&local_2b8,0);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_2a8,(ReturnAction *)&local_2b8);
  testing::internal::
  TypedExpectation<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
  ::WillOnce(this_05,&local_2a8);
  testing::
  Action<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
  ::~Action(&local_2a8);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_2b8);
  testing::internal::
  MockSpec<int_(const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int)>
  ::~MockSpec(&local_230);
  testing::Matcher<unsigned_int>::~Matcher(&local_280);
  testing::Matcher<int>::~Matcher(&local_268);
  testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>::
  ~Matcher(&local_248);
  pWVar2 = &mock_ptr<testing::StrictMock<solitaire::SDL::WrapperMock>_>::operator*
                      (&(this->super_SDLGraphicsSystemWithCreatedWindowTests).
                        super_SDLGraphicsSystemTests.sdlMock)->super_WrapperMock;
  local_310 = (SDL_Renderer_conflict *)
              testing::no_adl::Pointer<SDL_Renderer*>
                        ((Snapshot **)&(anonymous_namespace)::rendererPtr);
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            (&local_308,(PointerMatcher *)&local_310);
  local_330 = (SDL_Surface *)
              testing::no_adl::Pointer<SDL_Surface*>
                        ((SDL_Surface **)&(anonymous_namespace)::surfacePtr);
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            (&local_328,(PointerMatcher *)&local_330);
  SDL::WrapperMock::gmock_createTextureFromSurface(&local_2f0,pWVar2,&local_308,&local_328);
  testing::internal::GetWithoutMatchers();
  this_06 = testing::internal::
            MockSpec<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
            ::operator()(&local_2f0,&local_331,(void *)0x0);
  this_07 = testing::internal::
            MockSpec<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
            ::InternalExpectedAt
                      (this_06,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x114,"*sdlMock",
                       "createTextureFromSurface(Pointer(rendererPtr), Pointer(surfacePtr))");
  testing::ReturnNull();
  testing::PolymorphicAction::operator_cast_to_Action(&local_358,&local_359);
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
  ::WillOnce(this_07,&local_358);
  testing::
  Action<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
  ::~Action(&local_358);
  testing::internal::
  MockSpec<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&)>
  ::~MockSpec(&local_2f0);
  testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>::
  ~Matcher(&local_328);
  testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~Matcher(&local_308);
  this_08 = &std::
             __shared_ptr_access<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_SDLGraphicsSystemWithCreatedWindowTests).
                             super_SDLGraphicsSystemTests.ptrDeleterMock)->super_PtrDeleterMock;
  testing::Matcher<SDL_Surface_*>::Matcher(&local_398,(SDL_Surface *)0x5);
  SDL::PtrDeleterMock::gmock_surfaceDeleter(&local_380,this_08,&local_398);
  testing::internal::GetWithoutMatchers();
  this_09 = testing::internal::MockSpec<void_(SDL_Surface_*)>::operator()
                      (&local_380,&local_399,(void *)0x0);
  testing::internal::MockSpec<void_(SDL_Surface_*)>::InternalExpectedAt
            (this_09,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x115,"*ptrDeleterMock","surfaceDeleter(surfacePtr)");
  testing::internal::MockSpec<void_(SDL_Surface_*)>::~MockSpec(&local_380);
  testing::Matcher<SDL_Surface_*>::~Matcher(&local_398);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  _Stack_3c8._M_head_impl = (Wrapper *)0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)&stack0xfffffffffffffc38);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool
                    ((TrueWithString *)&stack0xfffffffffffffc38);
  if (bVar1) {
    local_3d0[7] = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      SDLGraphicsSystem::loadTexture
                ((SDLGraphicsSystem *)local_3d0,
                 (string *)
                 &(this->super_SDLGraphicsSystemWithCreatedWindowTests).super_SDLGraphicsSystemTests
                  .system);
    }
    if ((local_3d0[7] & 1) != 0) goto LAB_002d4a91;
    std::__cxx11::string::operator=
              ((string *)&stack0xfffffffffffffc38,
               "Expected: system.loadTexture(texturePath) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_410);
  message = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_418,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x116,message);
  testing::internal::AssertHelper::operator=(&local_418,local_410);
  testing::internal::AssertHelper::~AssertHelper(&local_418);
  testing::Message::~Message(local_410);
LAB_002d4a91:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)&stack0xfffffffffffffc38);
  SDLGraphicsSystemTests::expectQuitSystem((SDLGraphicsSystemTests *)this);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithCreatedWindowTests,
       throwIfSDLCreateTextureFromSurfaceFailedDuringLoadTexture)
{
    EXPECT_CALL(*sdlMock, loadBMP(texturePath))
        .WillOnce(Return(ByMove(makeSDLSurface(surfacePtr))));
    EXPECT_CALL(*sdlMock, mapRGB(Pointer(surfacePtr), 0, 255, 255))
        .WillOnce(Return(mapRGBResult));
    EXPECT_CALL(*sdlMock, setColorKey(Pointer(surfacePtr), SDL_TRUE, mapRGBResult))
        .WillOnce(Return(success));
    EXPECT_CALL(*sdlMock,
        createTextureFromSurface(Pointer(rendererPtr), Pointer(surfacePtr))
    ).WillOnce(ReturnNull());
    EXPECT_CALL(*ptrDeleterMock, surfaceDeleter(surfacePtr));
    EXPECT_THROW(system.loadTexture(texturePath), std::runtime_error);
    expectQuitSystem();
}